

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O2

bool all_kv_in_other(gguf_context *ctx,gguf_context *other)

{
  bool bVar1;
  uint uVar2;
  gguf_type gVar3;
  gguf_type gVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  size_t arr_i;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  string str;
  string str_other;
  allocator<char> local_91;
  gguf_context *local_90;
  ulong local_88;
  long local_80;
  gguf_context *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = other;
  uVar2 = gguf_get_n_kv();
  uVar12 = 0;
  uVar13 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar13 = uVar12;
  }
  bVar10 = true;
  local_88 = uVar13;
  local_78 = ctx;
  do {
    if (uVar12 == uVar13) {
      return bVar10;
    }
    uVar5 = gguf_get_key(ctx,uVar12);
    uVar2 = gguf_find_key(local_90,uVar5);
    if ((int)uVar2 < 0) {
      bVar10 = false;
    }
    else {
      gVar3 = gguf_get_kv_type(ctx,uVar12);
      uVar2 = uVar2 & 0x7fffffff;
      gVar4 = gguf_get_kv_type(local_90,uVar2);
      if (gVar3 != gVar4) goto LAB_00108d1f;
      if (gVar3 == GGUF_TYPE_STRING) {
        pcVar8 = (char *)gguf_get_val_str(ctx,uVar12);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,pcVar8,(allocator<char> *)&local_50);
        pcVar8 = (char *)gguf_get_val_str(local_90,uVar2);
        uVar13 = local_88;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar8,&local_91);
        bVar1 = std::operator!=(&local_70,&local_50);
        bVar10 = (bool)(!bVar1 & bVar10);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else if (gVar3 == GGUF_TYPE_ARRAY) {
        lVar6 = gguf_get_arr_n(ctx,uVar12);
        lVar7 = gguf_get_arr_n(local_90,uVar2);
        local_80 = lVar6;
        if (lVar6 == lVar7) {
          gVar3 = gguf_get_arr_type(ctx,uVar12);
          gVar4 = gguf_get_arr_type(local_90,uVar2);
          if (gVar3 == gVar4) {
            if (gVar3 == GGUF_TYPE_BOOL) {
              lVar6 = gguf_get_arr_data(ctx,uVar12);
              lVar7 = gguf_get_arr_data(local_90,uVar2);
              for (lVar11 = 0; uVar13 = local_88, local_80 != lVar11; lVar11 = lVar11 + 1) {
                bVar10 = (bool)(bVar10 & (*(char *)(lVar7 + lVar11) == '\0') !=
                                         (*(char *)(lVar6 + lVar11) != '\0'));
              }
            }
            else {
              if (gVar3 != GGUF_TYPE_STRING) {
                pcVar8 = (char *)gguf_get_arr_data(ctx,uVar12);
                pcVar9 = (char *)gguf_get_arr_data(local_90,uVar2);
                lVar6 = gguf_type_size(gVar3);
                bVar1 = std::__equal<true>::equal<signed_char>
                                  (pcVar8,pcVar8 + local_80 * lVar6,pcVar9);
                goto LAB_00108dd7;
              }
              for (lVar6 = 0; uVar13 = local_88, local_80 != lVar6; lVar6 = lVar6 + 1) {
                pcVar8 = (char *)gguf_get_arr_str(ctx,uVar12,lVar6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_70,pcVar8,(allocator<char> *)&local_50);
                pcVar8 = (char *)gguf_get_arr_str(local_90,uVar2,lVar6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,pcVar8,&local_91);
                bVar1 = std::operator!=(&local_70,&local_50);
                bVar10 = (bool)(bVar10 & !bVar1);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
              }
            }
            goto LAB_00108de1;
          }
        }
LAB_00108d1f:
        bVar10 = false;
        uVar13 = local_88;
      }
      else {
        pcVar8 = (char *)gguf_get_val_data(ctx,uVar12);
        pcVar9 = (char *)gguf_get_val_data(local_90,uVar2);
        lVar6 = gguf_type_size(gVar3);
        ctx = local_78;
        bVar1 = std::__equal<true>::equal<char>(pcVar8,pcVar8 + lVar6,pcVar9);
LAB_00108dd7:
        bVar10 = (bool)(bVar1 & bVar10);
        uVar13 = local_88;
      }
    }
LAB_00108de1:
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static bool all_kv_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_kv = gguf_get_n_kv(ctx);
    for (int id = 0; id < n_kv; ++id) {
        const char * name = gguf_get_key(ctx, id);

        const int idx_other = gguf_find_key(other, name);
        if (idx_other < 0) {
            ok = false;
            continue;
        }

        const gguf_type type = gguf_get_kv_type(ctx, id);
        if (type != gguf_get_kv_type(other, idx_other)) {
            ok = false;
            continue;
        }

        if (type == GGUF_TYPE_ARRAY) {
            const size_t arr_n = gguf_get_arr_n(ctx, id);
            if (arr_n != gguf_get_arr_n(other, idx_other)) {
                ok = false;
                continue;
            }

            const gguf_type type_arr = gguf_get_arr_type(ctx, id);
            if (type_arr != gguf_get_arr_type(other, idx_other)) {
                ok = false;
                continue;
            }

            if (type_arr == GGUF_TYPE_BOOL) {
                const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
                const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    if (bool(data[arr_i]) != bool(data_other[arr_i])) {
                        ok = false;
                    }
                }
                continue;
            }

            if (type_arr == GGUF_TYPE_STRING) {
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    const std::string str       = gguf_get_arr_str(ctx,   id,       arr_i);
                    const std::string str_other = gguf_get_arr_str(other, idx_other, arr_i);
                    if (str != str_other) {
                        ok = false;
                    }
                }
                continue;
            }

            const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
            const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
            if (!std::equal(data, data + arr_n*gguf_type_size(type_arr), data_other)) {
                ok = false;
            }
            continue;
        }

        if (type == GGUF_TYPE_STRING) {
            const std::string str       = gguf_get_val_str(ctx,   id);
            const std::string str_other = gguf_get_val_str(other, idx_other);
            if (str != str_other) {
                ok = false;
            }
            continue;
        }

        const char * data       = reinterpret_cast<const char *>(gguf_get_val_data(ctx,   id));
        const char * data_other = reinterpret_cast<const char *>(gguf_get_val_data(other, idx_other));
        if (!std::equal(data, data + gguf_type_size(type), data_other)) {
            ok = false;
        }
    }

    return ok;
}